

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O2

void __thiscall
ON_SubDComponentIterator::ON_SubDComponentIterator(ON_SubDComponentIterator *this,ON_SubD *subd)

{
  ON_SubDRef local_70;
  ON_SubDComponentIterator local_60;
  
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_subd_level = 0;
  this->m_vertex_first = (ON_SubDVertex *)0x0;
  this->m_vertex_last = (ON_SubDVertex *)0x0;
  this->m_edge_first = (ON_SubDEdge *)0x0;
  this->m_edge_last = (ON_SubDEdge *)0x0;
  this->m_face_first = (ON_SubDFace *)0x0;
  this->m_face_last = (ON_SubDFace *)0x0;
  (this->m_cptr_current).m_ptr = 0;
  ON_SubDRef::CreateReferenceForExperts(&local_70,subd);
  ON_SubDComponentIterator(&local_60,&local_70);
  operator=(this,&local_60);
  ON_SubDRef::~ON_SubDRef(&local_60.m_subd_ref);
  ON_SubDRef::~ON_SubDRef(&local_70);
  return;
}

Assistant:

ON_SubDComponentIterator::ON_SubDComponentIterator(
  const class ON_SubD& subd
  )
{
  *this = ON_SubDComponentIterator(ON_SubDRef::CreateReferenceForExperts(subd));
}